

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.hpp
# Opt level: O0

void __thiscall rek::sample::AliasSampler::initSampler(AliasSampler *this)

{
  double dVar1;
  value_type vVar2;
  value_type vVar3;
  uint uVar4;
  reference pvVar5;
  reference pvVar6;
  uint local_18;
  uint k;
  uint j;
  uint i;
  AliasSampler *this_local;
  
  if (this->N == 0) {
    __assert_fail("1 <= N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                  ,0x46,"void rek::sample::AliasSampler::initSampler()");
  }
  for (k = 1; k <= this->N; k = k + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->A,(ulong)k)
    ;
    *pvVar5 = k;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->B,(ulong)k)
    ;
    *pvVar5 = k;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)k);
    if (*pvVar6 < 0.0) {
      __assert_fail("Y[i] >= 0.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                    ,0x4a,"void rek::sample::AliasSampler::initSampler()");
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)k);
    dVar1 = *pvVar6;
    uVar4 = this->N;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)k);
    *pvVar6 = dVar1 * (double)uVar4;
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->B,0);
  *pvVar5 = 0;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,0);
  *pvVar6 = 0.0;
  uVar4 = this->N;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->B,(ulong)(this->N + 1));
  *pvVar5 = uVar4 + 1;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)(this->N + 1));
  *pvVar6 = 2.0;
  k = 0;
  local_18 = this->N + 1;
  uVar4 = k;
  while( true ) {
    do {
      k = uVar4;
      uVar4 = k + 1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->B,(ulong)uVar4);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
      k = local_18;
    } while (*pvVar6 <= 1.0 && *pvVar6 != 1.0);
    do {
      local_18 = k;
      k = local_18 - 1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->B,(ulong)k);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
    } while (1.0 <= *pvVar6);
    if (k <= uVar4) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->B,(ulong)uVar4);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->B,(ulong)k)
    ;
    vVar3 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->B,(ulong)uVar4);
    *pvVar5 = vVar3;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->B,(ulong)k)
    ;
    *pvVar5 = vVar2;
    local_18 = k;
  }
  while( true ) {
    if (k == 0) {
      return;
    }
    while( true ) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->B,(ulong)local_18);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
      if (1.0 < *pvVar6) break;
      local_18 = local_18 + 1;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->B,(ulong)k)
    ;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
    if (1.0 < *pvVar6 || *pvVar6 == 1.0) {
      __assert_fail("Y[B[i]] < 1.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                    ,0x65,"void rek::sample::AliasSampler::initSampler()");
    }
    if (this->N < local_18) {
      return;
    }
    if (this->N < local_18) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->B,(ulong)local_18);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
    if (*pvVar6 <= 1.0) {
      __assert_fail("Y[B[j]] > 1.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                    ,0x68,"void rek::sample::AliasSampler::initSampler()");
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->B,(ulong)k)
    ;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
    dVar1 = *pvVar6;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->B,(ulong)local_18);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
    *pvVar6 = *pvVar6 - (1.0 - dVar1);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->B,(ulong)local_18);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->B,(ulong)k)
    ;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->A,(ulong)*pvVar5);
    *pvVar5 = vVar2;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->B,(ulong)local_18);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)*pvVar5);
    if (1.0 < *pvVar6 || *pvVar6 == 1.0) {
      k = k - 1;
    }
    else {
      if (local_18 <= k) {
        __assert_fail("i < j",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                      ,0x6c,"void rek::sample::AliasSampler::initSampler()");
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->B,(ulong)k);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->B,(ulong)local_18);
      vVar3 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->B,(ulong)k);
      *pvVar5 = vVar3;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->B,(ulong)local_18);
      *pvVar5 = vVar2;
      local_18 = local_18 + 1;
    }
  }
  __assert_fail("j <= N",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                ,0x67,"void rek::sample::AliasSampler::initSampler()");
}

Assistant:

void initSampler() {
    unsigned int i, j, k;
    assert(1 <= N);
    for (i = 1; i <= N; i++) {
      A[i] = i;
      B[i] = i; /* initial destins=stay there */
      assert(Y[i] >= 0.0);
      Y[i] = Y[i] * N; /* scale probvec */
    }
    B[0] = 0;
    Y[0] = 0.0;
    B[N + 1] = N + 1;
    Y[N + 1] = 2.0; /* sentinels */
    i = 0;
    j = N + 1;
    for (;;) {
      do {
        i++;
      } while (Y[B[i]] < 1.0); /* find i so X[B[i]] needs more */
      do {
        j--;
      } while (Y[B[j]] >= 1.0); /* find j so X[B[j]] wants less */
      if (i >= j) break;
      k = B[i];
      B[i] = B[j];
      B[j] = k; /* swap B[i], B[j] */
    }

    i = j;
    j++;
    while (i > 0) {
      while (Y[B[j]] <= 1.0) j++;
      /* find j so X[B[j]] needs more */
      assert(Y[B[i]] < 1.0); /* meanwhile X[B[i]] wants less */
      if (j > N) break;
      assert(j <= N);
      assert(Y[B[j]] > 1.0);
      Y[B[j]] -= 1.0 - Y[B[i]]; /* B[i] will donate to B[j] to fix up */
      A[B[i]] = B[j];
      if (Y[B[j]] < 1.0) { /* X[B[j]] now wants less so readjust ordering */
        assert(i < j);
        k = B[i];
        B[i] = B[j];
        B[j] = k; /* swap B[j], B[i] */
        j++;
      } else
        i--;
    }
  }